

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sig_catch.c
# Opt level: O2

void sig_catch(int sig,_func_void_varargs *f)

{
  sigaction sa;
  _union_1457 local_a0;
  sigset_t local_98;
  undefined4 local_18;
  
  local_18 = 0;
  local_a0 = (_union_1457)f;
  sigemptyset(&local_98);
  sigaction(sig,(sigaction *)&local_a0,(sigaction *)0x0);
  return;
}

Assistant:

void sig_catch(int sig,void (*f)())
{
#ifdef HASSIGACTION
  struct sigaction sa;
  sa.sa_handler = f;
  sa.sa_flags = 0;
  sigemptyset(&sa.sa_mask);
  sigaction(sig,&sa,(struct sigaction *) 0);
#else
  signal(sig,f); /* won't work under System V, even nowadays---dorks */
#endif
}